

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.cc
# Opt level: O1

void RigidBodyDynamics::jcalc(Model *model,uint joint_id,VectorNd *q,VectorNd *qdot)

{
  double *pdVar1;
  JointType JVar2;
  uint uVar3;
  pointer pJVar4;
  double *pdVar5;
  pointer pSVar6;
  SpatialVector *pSVar7;
  pointer pSVar8;
  pointer pMVar9;
  CustomJoint *pCVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  pointer pSVar23;
  ostream *poVar24;
  RBDLError *this;
  long lVar25;
  SpatialTransform *pSVar26;
  pointer pSVar27;
  byte bVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  ostringstream errormsg;
  Quaternion local_1e8;
  string local_1c8;
  SpatialTransform local_1a8 [3];
  
  bVar28 = 0;
  pJVar4 = (model->mJoints).
           super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
           .
           super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  JVar2 = pJVar4[joint_id].mJointType;
  if ((int)JVar2 < 5) {
    if (JVar2 == JointTypeRevoluteX) {
      uVar3 = pJVar4[joint_id].q_index;
      pdVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      dVar14 = sin(pdVar5[uVar3]);
      dVar15 = cos(pdVar5[uVar3]);
      pSVar6 = (model->X_J).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)&pSVar6[joint_id].E.super_Matrix3d = 0x3ff0000000000000;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x18) = 0.0;
      pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 8);
      *pdVar5 = 0.0;
      pdVar5[1] = 0.0;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x20) = dVar15;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x28) = -dVar14;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x30) = 0.0;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x38) = dVar14;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x40) = dVar15;
      *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) = 0.0;
      *(undefined8 *)
       &pSVar6[joint_id].r.super_Vector3d.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> = 0;
      *(double *)
       ((long)&pSVar6[joint_id].r.super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) = 0.0;
      *(double *)
       &(model->v_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
        super__Vector_impl_data._M_start[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
           (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [(model->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index];
      goto LAB_00176fc8;
    }
    if (JVar2 == JointTypeRevoluteY) {
      uVar3 = pJVar4[joint_id].q_index;
      pdVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      dVar14 = sin(pdVar5[uVar3]);
      dVar15 = cos(pdVar5[uVar3]);
      pSVar6 = (model->X_J).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(double *)&pSVar6[joint_id].E.super_Matrix3d = dVar15;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 8) = 0.0;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x10) = dVar14;
      pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x18);
      *pdVar5 = 0.0;
      pdVar5[1] = 1.0;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x28) = 0.0;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x30) = -dVar14;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x38) = 0.0;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x40) = dVar15;
      *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) = 0.0;
      *(undefined8 *)
       &pSVar6[joint_id].r.super_Vector3d.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> = 0;
      *(double *)
       ((long)&pSVar6[joint_id].r.super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) = 0.0;
      *(double *)
       ((long)&(model->v_J).
               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start[joint_id].
               super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
           (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [(model->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index];
      goto LAB_00176fc8;
    }
  }
  else {
    if (JVar2 == JointTypeRevoluteZ) {
      uVar3 = pJVar4[joint_id].q_index;
      pdVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      dVar14 = sin(pdVar5[uVar3]);
      dVar15 = cos(pdVar5[uVar3]);
      pSVar6 = (model->X_J).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(double *)&pSVar6[joint_id].E.super_Matrix3d = dVar15;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 8) = -dVar14;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x10) = 0.0;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x18) = dVar14;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x20) = dVar15;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x38) = 0.0;
      pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x28);
      *pdVar5 = 0.0;
      pdVar5[1] = 0.0;
      *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x40) = 1.0;
      *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) = 0.0;
      *(undefined8 *)
       &pSVar6[joint_id].r.super_Vector3d.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> = 0;
      *(double *)
       ((long)&pSVar6[joint_id].r.super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) = 0.0;
      *(double *)
       ((long)&(model->v_J).
               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start[joint_id].
               super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) =
           (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [(model->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index];
      goto LAB_00176fc8;
    }
    if (JVar2 == JointTypeHelical) {
      jcalc_XJ(local_1a8,model,joint_id,q);
      pSVar6 = (model->X_J).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar26 = local_1a8;
      pSVar27 = pSVar6 + joint_id;
      for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
        *(double *)&(pSVar27->E).super_Matrix3d =
             (pSVar26->E).super_Matrix3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
        pSVar26 = (SpatialTransform *)((long)pSVar26 + (ulong)bVar28 * -0x10 + 8);
        pSVar27 = (pointer)((long)pSVar27 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) =
           local_1a8[0].r.super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
      *(double *)
       &pSVar6[joint_id].r.super_Vector3d.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
           local_1a8[0].r.super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
      *(double *)
       ((long)&pSVar6[joint_id].r.super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
           local_1a8[0].r.super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
      jcalc_X_lambda_S(model,joint_id,q);
      pSVar23 = (model->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      dVar14 = (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data[(model->mJoints).
                      super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index];
      pSVar8 = (model->v_J).
               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar22 = -dVar14 * dVar14;
      dVar15 = *(double *)
                ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
      *(double *)
       &pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
           *(double *)
            &pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * dVar14;
      *(double *)
       ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = dVar15 * dVar14;
      pdVar5 = (double *)
               ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      dVar15 = pdVar5[1];
      pdVar1 = (double *)
               ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      *pdVar1 = *pdVar5 * dVar14;
      pdVar1[1] = dVar15 * dVar14;
      pdVar5 = (double *)
               ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      dVar15 = dVar14 * pdVar5[1];
      auVar12._8_4_ = SUB84(dVar15,0);
      auVar12._0_8_ = dVar14 * *pdVar5;
      auVar12._12_4_ = (int)((ulong)dVar15 >> 0x20);
      *(undefined1 (*) [16])
       ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar12;
      pSVar8 = (model->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pSVar23 = pSVar8 + joint_id;
      dVar16 = *(double *)
                &(pSVar23->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
      dVar17 = *(double *)
                ((long)&(pSVar23->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
      pSVar6 = (model->X_J).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar7 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start[joint_id].mJointAxes;
      pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x18);
      pdVar1 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x30);
      dVar14 = *(double *)((long)&pSVar7->super_Matrix<double,_6,_1,_0,_6,_1> + 0x28);
      dVar15 = *(double *)((long)&pSVar7->super_Matrix<double,_6,_1,_0,_6,_1> + 0x18);
      dVar29 = *(double *)((long)&pSVar7->super_Matrix<double,_6,_1,_0,_6,_1> + 0x20);
      dVar31 = dVar29 * *pdVar5 + dVar15 * *(double *)&pSVar6[joint_id].E.super_Matrix3d +
               dVar14 * *pdVar1;
      dVar33 = dVar29 * pdVar5[1] +
               dVar15 * *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 8) +
               dVar14 * pdVar1[1];
      dVar29 = *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x28) * dVar29 +
               dVar14 * *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x40) +
               *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x10) * dVar15;
      dVar14 = *(double *)
                ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      dVar15 = dVar22 * (dVar14 * dVar31 - dVar29 * dVar16);
      pSVar23 = (model->c_J).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)
       &pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
      *(double *)
       ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
      *(double *)
       ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
      auVar13._8_4_ = SUB84(dVar15,0);
      auVar13._0_8_ = dVar22 * (dVar29 * dVar17 - dVar33 * dVar14);
      auVar13._12_4_ = (int)((ulong)dVar15 >> 0x20);
      *(undefined1 (*) [16])
       ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = auVar13;
      *(double *)
       ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) =
           dVar22 * (dVar33 * dVar16 - dVar17 * dVar31);
      goto LAB_00176fc8;
    }
  }
  if ((JVar2 != JointTypeCustom) && (pJVar4[joint_id].mDoFCount == 1)) {
    jcalc_XJ(local_1a8,model,joint_id,q);
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar26 = local_1a8;
    pSVar27 = pSVar6 + joint_id;
    for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
      *(double *)&(pSVar27->E).super_Matrix3d =
           (pSVar26->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pSVar26 = (SpatialTransform *)((long)pSVar26 + (ulong)bVar28 * -0x10 + 8);
      pSVar27 = (pointer)((long)pSVar27 + ((ulong)bVar28 * -2 + 1) * 8);
    }
    *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) =
         local_1a8[0].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    *(double *)
     &pSVar6[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = local_1a8[0].r.super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    *(double *)
     ((long)&pSVar6[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
         local_1a8[0].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[1];
    pSVar23 = (model->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar8 = (model->v_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    dVar14 = (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
             [(model->mJoints).
              super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              .
              super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index];
    dVar15 = *(double *)
              ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) * dVar14;
    auVar18._8_4_ = SUB84(dVar15,0);
    auVar18._0_8_ =
         *(double *)
          &pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * dVar14;
    auVar18._12_4_ = (int)((ulong)dVar15 >> 0x20);
    *(undefined1 (*) [16])
     &pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar18;
    pdVar5 = (double *)
             ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
    dVar15 = pdVar5[1] * dVar14;
    auVar19._8_4_ = SUB84(dVar15,0);
    auVar19._0_8_ = *pdVar5 * dVar14;
    auVar19._12_4_ = (int)((ulong)dVar15 >> 0x20);
    *(undefined1 (*) [16])
     ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar19;
    pdVar5 = (double *)
             ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
    dVar15 = dVar14 * pdVar5[1];
    auVar11._8_4_ = SUB84(dVar15,0);
    auVar11._0_8_ = dVar14 * *pdVar5;
    auVar11._12_4_ = (int)((ulong)dVar15 >> 0x20);
    *(undefined1 (*) [16])
     ((long)&pSVar8[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar11;
    goto LAB_00176fc8;
  }
  switch(JVar2) {
  case JointTypeSpherical:
    uVar3 = pJVar4[joint_id].q_index;
    pdVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_1e8.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         pdVar5[uVar3];
    local_1e8.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         pdVar5[uVar3 + 1];
    local_1e8.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
         pdVar5[uVar3 + 2];
    local_1e8.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
         pdVar5[(model->multdof3_w_index).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[joint_id]];
    Math::Quaternion::toMatrix(&local_1e8);
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    memmove(pSVar6 + joint_id,local_1a8,0x48);
    *(undefined8 *)
     &pSVar6[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = 0;
    *(double *)
     ((long)&pSVar6[joint_id].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) = 0.0;
    *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) = 0.0;
    pMVar9 = (model->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)
     &pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage =
         0x3ff0000000000000;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x38) = 1.0;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x70) = 1.0;
    pSVar23 = (model->v_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
              .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar3 = (model->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index;
    pdVar5 = (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    dVar14 = pdVar5[uVar3 + 1];
    dVar15 = pdVar5[uVar3 + 2];
    *(double *)
     &pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = pdVar5[uVar3];
    *(double *)
     ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = dVar14;
    *(double *)
     ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = dVar15;
    pdVar5 = (double *)
             ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
    *pdVar5 = 0.0;
    pdVar5[1] = 0.0;
    *(double *)
     ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = 0.0;
    break;
  case JointTypeEulerZYX:
    uVar3 = pJVar4[joint_id].q_index;
    pdVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar14 = pdVar5[uVar3];
    dVar15 = pdVar5[uVar3 + 1];
    dVar22 = pdVar5[uVar3 + 2];
    dVar16 = sin(dVar14);
    dVar14 = cos(dVar14);
    dVar17 = sin(dVar15);
    dVar29 = cos(dVar15);
    dVar31 = sin(dVar22);
    dVar33 = cos(dVar22);
    dVar30 = dVar29 * dVar31;
    dVar32 = dVar29 * dVar33;
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(double *)&pSVar6[joint_id].E.super_Matrix3d = dVar14 * dVar29;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 8);
    *pdVar5 = dVar14 * dVar17 * dVar31 + -dVar16 * dVar33;
    pdVar5[1] = dVar14 * dVar17 * dVar33 + dVar31 * dVar16;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x18) = dVar16 * dVar29;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x20);
    *pdVar5 = dVar16 * dVar17 * dVar31 + dVar33 * dVar14;
    pdVar5[1] = dVar16 * dVar17 * dVar33 + -dVar14 * dVar31;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x30) = -dVar17;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x38) = dVar30;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x40) = dVar32;
    pMVar9 = (model->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1e8.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         (double)(pMVar9 + joint_id);
    *(double *)
     &pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage =
         -dVar17;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x60) = 1.0;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 8) = dVar30;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x38) = dVar33;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x10) = dVar32;
    uVar3 = (model->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index;
    pdVar5 = (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x40) = -dVar31;
    dVar14 = pdVar5[uVar3];
    dVar15 = pdVar5[uVar3 + 1];
    dVar22 = pdVar5[uVar3 + 2];
    local_1e8.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         (double)local_1a8;
    local_1a8[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = dVar14;
    local_1a8[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = dVar15;
    local_1a8[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = dVar22;
    SpatialVector_t::operator=
              ((model->v_J).
               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + joint_id,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_1e8);
    pSVar23 = (model->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
              .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    dVar16 = (-dVar30 * dVar14 * dVar22 - dVar17 * dVar33 * dVar14 * dVar15) -
             dVar15 * dVar33 * dVar22;
    *(double *)
     &pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = -dVar29 * dVar14 * dVar15;
    auVar21._8_4_ = SUB84(dVar16,0);
    auVar21._0_8_ =
         (dVar32 * dVar14 * dVar22 - dVar17 * dVar31 * dVar14 * dVar15) - dVar15 * dVar31 * dVar22;
    auVar21._12_4_ = (int)((ulong)dVar16 >> 0x20);
    *(undefined1 (*) [16])
     ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = auVar21;
    goto LAB_00177b34;
  case JointTypeEulerXYZ:
    uVar3 = pJVar4[joint_id].q_index;
    pdVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar14 = pdVar5[uVar3];
    dVar15 = pdVar5[uVar3 + 1];
    dVar22 = pdVar5[uVar3 + 2];
    dVar16 = sin(dVar14);
    dVar14 = cos(dVar14);
    dVar17 = sin(dVar15);
    dVar29 = cos(dVar15);
    dVar31 = sin(dVar22);
    dVar33 = cos(dVar22);
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(double *)&pSVar6[joint_id].E.super_Matrix3d = dVar29 * dVar33;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x10) = dVar17;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x28) = -dVar29 * dVar16;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x40) = dVar14 * dVar29;
    dVar32 = -dVar31;
    dVar30 = dVar29 * dVar32;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 8) = dVar30;
    dVar34 = -dVar33 * dVar17;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x18);
    *pdVar5 = dVar31 * dVar14 + dVar17 * dVar33 * dVar16;
    pdVar5[1] = dVar33 * dVar14 + dVar17 * dVar32 * dVar16;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x30);
    *pdVar5 = dVar31 * dVar16 + dVar14 * dVar34;
    pdVar5[1] = dVar33 * dVar16 + dVar14 * dVar31 * dVar17;
    pMVar9 = (model->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1e8.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         (double)(pMVar9 + joint_id);
    *(double *)
     &pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage =
         dVar29 * dVar33;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x30) = dVar31;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 8) = dVar30;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x38) = dVar33;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x10) = dVar17;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x70) = 1.0;
    uVar3 = (model->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index;
    pdVar5 = (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    dVar14 = pdVar5[uVar3];
    dVar15 = pdVar5[uVar3 + 1];
    dVar22 = pdVar5[uVar3 + 2];
    local_1e8.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         (double)local_1a8;
    local_1a8[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = dVar14;
    local_1a8[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = dVar15;
    local_1a8[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = dVar22;
    SpatialVector_t::operator=
              ((model->v_J).
               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + joint_id,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_1e8);
    pSVar23 = (model->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
              .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    dVar16 = dVar29 * dVar15 * dVar14;
    *(double *)
     &pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
         dVar22 * dVar33 * dVar15 + dVar14 * dVar30 * dVar22 + dVar34 * dVar15 * dVar14;
    *(double *)
     ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
         dVar22 * dVar32 * dVar15 +
         dVar14 * dVar29 * -dVar33 * dVar22 + dVar31 * dVar17 * dVar15 * dVar14;
    goto LAB_00177b2d;
  case JointTypeEulerYXZ:
    uVar3 = pJVar4[joint_id].q_index;
    pdVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar14 = pdVar5[uVar3];
    dVar15 = pdVar5[uVar3 + 1];
    dVar22 = pdVar5[uVar3 + 2];
    dVar16 = sin(dVar14);
    dVar14 = cos(dVar14);
    dVar17 = sin(dVar15);
    dVar29 = cos(dVar15);
    dVar31 = sin(dVar22);
    dVar33 = cos(dVar22);
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar32 = dVar17 * dVar31;
    dVar34 = dVar17 * dVar33;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x10) = dVar16 * dVar29;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x18) = dVar29 * dVar31;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x40) = dVar14 * dVar29;
    dVar30 = -dVar31;
    dVar35 = dVar29 * dVar33;
    *(double *)&pSVar6[joint_id].E.super_Matrix3d = dVar33 * dVar14 + dVar16 * dVar32;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 8) = dVar30 * dVar14 + dVar16 * dVar34;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x20);
    *pdVar5 = dVar35;
    pdVar5[1] = -dVar17;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x30);
    *pdVar5 = -dVar33 * dVar16 + dVar14 * dVar32;
    pdVar5[1] = dVar31 * dVar16 + dVar14 * dVar34;
    pMVar9 = (model->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1e8.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         (double)(pMVar9 + joint_id);
    *(double *)
     &pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage =
         dVar29 * dVar31;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x30) = dVar33;
    pdVar5 = (double *)
             ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage + 8);
    *pdVar5 = dVar35;
    pdVar5[1] = -dVar17;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x38) = dVar30;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x70) = 1.0;
    uVar3 = (model->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index;
    pdVar5 = (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    dVar14 = pdVar5[uVar3];
    dVar15 = pdVar5[uVar3 + 1];
    dVar22 = pdVar5[uVar3 + 2];
    local_1e8.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         (double)local_1a8;
    local_1a8[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = dVar14;
    local_1a8[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = dVar15;
    local_1a8[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = dVar22;
    SpatialVector_t::operator=
              ((model->v_J).
               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + joint_id,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_1e8);
    pSVar23 = (model->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
              .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    dVar17 = (dVar14 * dVar29 * dVar30 * dVar22 - dVar34 * dVar15 * dVar14) -
             dVar22 * dVar33 * dVar15;
    dVar16 = -dVar29 * dVar15 * dVar14;
    auVar20._8_4_ = SUB84(dVar17,0);
    auVar20._0_8_ = (dVar14 * dVar35 * dVar22 - dVar32 * dVar15 * dVar14) - dVar22 * dVar31 * dVar15
    ;
    auVar20._12_4_ = (int)((ulong)dVar17 >> 0x20);
    *(undefined1 (*) [16])
     &pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar20;
LAB_00177b2d:
    *(double *)
     ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = dVar16;
LAB_00177b34:
    pdVar5 = (double *)
             ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
    *pdVar5 = 0.0;
    pdVar5[1] = 0.0;
    *(double *)
     ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = 0.0;
    break;
  case JointTypeTranslationXYZ:
    uVar3 = pJVar4[joint_id].q_index;
    pdVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar14 = pdVar5[uVar3];
    dVar15 = pdVar5[uVar3 + 1];
    dVar22 = pdVar5[uVar3 + 2];
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)&pSVar6[joint_id].E.super_Matrix3d = 0x3ff0000000000000;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 8);
    *pdVar5 = 0.0;
    pdVar5[1] = 0.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x18) = 0.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x20) = 1.0;
    pdVar5 = (double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x28);
    *pdVar5 = 0.0;
    pdVar5[1] = 0.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x38) = 0.0;
    *(double *)((long)&pSVar6[joint_id].E.super_Matrix3d + 0x40) = 1.0;
    pSVar6 = (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(double *)
     &pSVar6[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
         = dVar14;
    *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 8) = dVar15;
    *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) = dVar22;
    pMVar9 = (model->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1e8.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         (double)(pMVar9 + joint_id);
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x18) = 1.0;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x50) = 1.0;
    *(double *)
     ((long)&pMVar9[joint_id].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage
     + 0x88) = 1.0;
    uVar3 = (model->mJoints).
            super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            .
            super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
            ._M_impl.super__Vector_impl_data._M_start[joint_id].q_index;
    pdVar5 = (qdot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    local_1a8[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = pdVar5[uVar3];
    local_1a8[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = pdVar5[uVar3 + 1];
    local_1a8[0].E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = pdVar5[uVar3 + 2];
    local_1e8.super_Vector4d.super_Vector4d.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         (double)local_1a8;
    SpatialVector_t::operator=
              ((model->v_J).
               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start + joint_id,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_1e8);
    pSVar23 = (model->c_J).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
              .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar5 = (double *)
             ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
    *pdVar5 = 0.0;
    pdVar5[1] = 0.0;
    pdVar5 = (double *)
             ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
    *pdVar5 = 0.0;
    pdVar5[1] = 0.0;
    *(undefined8 *)
     &pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
    *(double *)
     ((long)&pSVar23[joint_id].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error: invalid joint type ",0x1a);
    poVar24 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)local_1a8,
                         (model->mJoints).
                         super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         ._M_impl.super__Vector_impl_data._M_start[joint_id].mJointType);
    std::__ostream_insert<char,std::char_traits<char>>(poVar24," at id ",7);
    poVar24 = std::ostream::_M_insert<unsigned_long>((ulong)poVar24);
    std::endl<char,std::char_traits<char>>(poVar24);
    this = (RBDLError *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    Errors::RBDLError::RBDLError(this,&local_1c8);
    __cxa_throw(this,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
  case JointTypeCustom:
    pCVar10 = (model->mCustomJoints).
              super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
              ._M_impl.super__Vector_impl_data._M_start[pJVar4[joint_id].custom_joint_index];
    (**(code **)(*(long *)pCVar10 + 0x10))(pCVar10,model,joint_id,q,qdot);
  }
LAB_00176fc8:
  Math::SpatialTransform::operator*
            (local_1a8,
             (model->X_J).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start + joint_id,
             (model->X_T).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start + joint_id);
  pSVar6 = (model->X_lambda).
           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           .
           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar26 = local_1a8;
  pSVar27 = pSVar6 + joint_id;
  for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
    *(double *)&(pSVar27->E).super_Matrix3d =
         (pSVar26->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[0];
    pSVar26 = (SpatialTransform *)((long)pSVar26 + (ulong)bVar28 * -0x10 + 8);
    pSVar27 = (pointer)((long)pSVar27 + ((ulong)bVar28 * -2 + 1) * 8);
  }
  *(double *)((long)&pSVar6[joint_id].r.super_Vector3d + 0x10) =
       local_1a8[0].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[2];
  *(double *)
   &pSVar6[joint_id].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
       local_1a8[0].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[0];
  *(double *)
   ((long)&pSVar6[joint_id].r.super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) =
       local_1a8[0].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
       m_storage.m_data.array[1];
  return;
}

Assistant:

RBDL_DLLAPI void jcalc (
    Model &model,
    unsigned int joint_id,
    const VectorNd &q,
    const VectorNd &qdot
    ) {
  // exception if we calculate it for the root body
  assert (joint_id > 0);

  if (model.mJoints[joint_id].mJointType == JointTypeRevoluteX) {
    model.X_J[joint_id] = Xrotx (q[model.mJoints[joint_id].q_index]);
    model.v_J[joint_id][0] = qdot[model.mJoints[joint_id].q_index];
  } else if (model.mJoints[joint_id].mJointType == JointTypeRevoluteY) {
    model.X_J[joint_id] = Xroty (q[model.mJoints[joint_id].q_index]);
    model.v_J[joint_id][1] = qdot[model.mJoints[joint_id].q_index];
  } else if (model.mJoints[joint_id].mJointType == JointTypeRevoluteZ) {
    model.X_J[joint_id] = Xrotz (q[model.mJoints[joint_id].q_index]);
    model.v_J[joint_id][2] = qdot[model.mJoints[joint_id].q_index];
  } else if (model.mJoints[joint_id].mJointType == JointTypeHelical) {
    model.X_J[joint_id] = jcalc_XJ (model, joint_id, q);
    jcalc_X_lambda_S(model, joint_id, q);
    Scalar Jqd = qdot[model.mJoints[joint_id].q_index];
    model.v_J[joint_id] = model.S[joint_id] * Jqd;

    Vector3d St = model.S[joint_id].block<3, 1>(0,0);
    Vector3d c = model.X_J[joint_id].E * model.mJoints[joint_id].mJointAxes[0].block<3, 1>(3,0);
    c = St.cross(c);
    c *= -Jqd * Jqd;    
    model.c_J[joint_id] = SpatialVector(0,0,0,c[0],c[1],c[2]);
  } else if (model.mJoints[joint_id].mDoFCount == 1 &&
      model.mJoints[joint_id].mJointType != JointTypeCustom) {
    model.X_J[joint_id] = jcalc_XJ (model, joint_id, q);
    model.v_J[joint_id] = 
      model.S[joint_id] * qdot[model.mJoints[joint_id].q_index];
  } else if (model.mJoints[joint_id].mJointType == JointTypeSpherical) {
    model.X_J[joint_id] = 
      SpatialTransform (model.GetQuaternion (joint_id, q).toMatrix(), 
          Vector3d (0., 0., 0.));

    model.multdof3_S[joint_id](0,0) = 1.;
    model.multdof3_S[joint_id](1,1) = 1.;
    model.multdof3_S[joint_id](2,2) = 1.;

    Vector3d omega (qdot[model.mJoints[joint_id].q_index],
        qdot[model.mJoints[joint_id].q_index+1],
        qdot[model.mJoints[joint_id].q_index+2]);

    model.v_J[joint_id] = SpatialVector (
        omega[0], omega[1], omega[2],
        0., 0., 0.);
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerZYX) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_J[joint_id].E = Matrix3d(
        c0 * c1, s0 * c1, -s1,
        c0 * s1 * s2 - s0 * c2, s0 * s1 * s2 + c0 * c2, c1 * s2,
        c0 * s1 * c2 + s0 * s2, s0 * s1 * c2 - c0 * s2, c1 * c2
        );

    model.multdof3_S[joint_id](0,0) = -s1;
    model.multdof3_S[joint_id](0,2) = 1.;

    model.multdof3_S[joint_id](1,0) = c1 * s2;
    model.multdof3_S[joint_id](1,1) = c2;

    model.multdof3_S[joint_id](2,0) = c1 * c2;
    model.multdof3_S[joint_id](2,1) = - s2;

    Scalar qdot0 = qdot[model.mJoints[joint_id].q_index];
    Scalar qdot1 = qdot[model.mJoints[joint_id].q_index + 1];
    Scalar qdot2 = qdot[model.mJoints[joint_id].q_index + 2];

    model.v_J[joint_id] = 
      model.multdof3_S[joint_id] * Vector3d (qdot0, qdot1, qdot2);

    model.c_J[joint_id].set(
        -c1*qdot0*qdot1,
        -s1*s2*qdot0*qdot1 + c1*c2*qdot0*qdot2 - s2*qdot1*qdot2,
        -s1*c2*qdot0*qdot1 - c1*s2*qdot0*qdot2 - c2*qdot1*qdot2,
        0.,0., 0.);
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerXYZ) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_J[joint_id].E = Matrix3d(
        c2 * c1, s2 * c0 + c2 * s1 * s0, s2 * s0 - c2 * s1 * c0,
        -s2 * c1, c2 * c0 - s2 * s1 * s0, c2 * s0 + s2 * s1 * c0,
        s1, -c1 * s0, c1 * c0
        );

    model.multdof3_S[joint_id](0,0) = c2 * c1;
    model.multdof3_S[joint_id](0,1) = s2;

    model.multdof3_S[joint_id](1,0) = -s2 * c1;
    model.multdof3_S[joint_id](1,1) = c2;

    model.multdof3_S[joint_id](2,0) = s1;
    model.multdof3_S[joint_id](2,2) = 1.;

    Scalar qdot0 = qdot[model.mJoints[joint_id].q_index];
    Scalar qdot1 = qdot[model.mJoints[joint_id].q_index + 1];
    Scalar qdot2 = qdot[model.mJoints[joint_id].q_index + 2];

    model.v_J[joint_id] = 
      model.multdof3_S[joint_id] * Vector3d (qdot0, qdot1, qdot2);

    model.c_J[joint_id].set(
        -s2*c1*qdot2*qdot0 - c2*s1*qdot1*qdot0 + c2*qdot2*qdot1,
        -c2*c1*qdot2*qdot0 + s2*s1*qdot1*qdot0 - s2*qdot2*qdot1,
        c1*qdot1*qdot0,
        0., 0., 0.
        );
  } else if (model.mJoints[joint_id].mJointType == JointTypeEulerYXZ) {
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    Scalar s0 = sin (q0);
    Scalar c0 = cos (q0);
    Scalar s1 = sin (q1);
    Scalar c1 = cos (q1);
    Scalar s2 = sin (q2);
    Scalar c2 = cos (q2);

    model.X_J[joint_id].E = Matrix3d(
        c2 * c0 + s2 * s1 * s0, s2 * c1, -c2 * s0 + s2 * s1 * c0,
        -s2 * c0 + c2 * s1 * s0, c2 * c1,  s2 * s0 + c2 * s1 * c0,
        c1 * s0,    - s1,                 c1 * c0);

    model.multdof3_S[joint_id](0,0) = s2 * c1;
    model.multdof3_S[joint_id](0,1) = c2;

    model.multdof3_S[joint_id](1,0) = c2 * c1;
    model.multdof3_S[joint_id](1,1) = -s2;

    model.multdof3_S[joint_id](2,0) = -s1;
    model.multdof3_S[joint_id](2,2) = 1.;

    Scalar qdot0 = qdot[model.mJoints[joint_id].q_index];
    Scalar qdot1 = qdot[model.mJoints[joint_id].q_index + 1];
    Scalar qdot2 = qdot[model.mJoints[joint_id].q_index + 2];

    model.v_J[joint_id] = 
      model.multdof3_S[joint_id] * Vector3d (qdot0, qdot1, qdot2);

    model.c_J[joint_id].set(
        c2*c1*qdot2*qdot0 - s2*s1*qdot1*qdot0 - s2*qdot2*qdot1,
        -s2*c1*qdot2*qdot0 - c2*s1*qdot1*qdot0 - c2*qdot2*qdot1,
        -c1*qdot1*qdot0,
        0., 0., 0.
        );
  } else if(model.mJoints[joint_id].mJointType == JointTypeTranslationXYZ){
    Scalar q0 = q[model.mJoints[joint_id].q_index];
    Scalar q1 = q[model.mJoints[joint_id].q_index + 1];
    Scalar q2 = q[model.mJoints[joint_id].q_index + 2];

    model.X_J[joint_id].E = Matrix3d::Identity();
    model.X_J[joint_id].r = Vector3d (q0, q1, q2);

    model.multdof3_S[joint_id](3,0) = 1.;
    model.multdof3_S[joint_id](4,1) = 1.;
    model.multdof3_S[joint_id](5,2) = 1.;

    Scalar qdot0 = qdot[model.mJoints[joint_id].q_index];
    Scalar qdot1 = qdot[model.mJoints[joint_id].q_index + 1];
    Scalar qdot2 = qdot[model.mJoints[joint_id].q_index + 2];

    model.v_J[joint_id] = 
      model.multdof3_S[joint_id] * Vector3d (qdot0, qdot1, qdot2);

    model.c_J[joint_id].set(0., 0., 0., 0., 0., 0.);
  } else if (model.mJoints[joint_id].mJointType == JointTypeCustom) {
    const Joint &joint = model.mJoints[joint_id];
    CustomJoint *custom_joint = 
      model.mCustomJoints[joint.custom_joint_index];
    custom_joint->jcalc (model, joint_id, q, qdot);
  } else {
    std::ostringstream errormsg;
    errormsg << "Error: invalid joint type " << model.mJoints[joint_id].mJointType << " at id " << joint_id << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  model.X_lambda[joint_id] = model.X_J[joint_id] * model.X_T[joint_id];
}